

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O1

_Bool search_directory_or_file(char *path,char *wildcard,_Bool isDirectory,char *result)

{
  char cVar1;
  _Bool _Var2;
  int iVar3;
  size_t sVar4;
  DIR *__dirp;
  dirent *pdVar5;
  code *pcVar6;
  size_t sVar7;
  char *__s1;
  _Bool _Var8;
  char temp [260];
  char local_138 [264];
  
  if ((path != (char *)0x0) && (sVar4 = strlen(path), wildcard != (char *)0x0 && sVar4 != 0)) {
    if (sVar4 - 0x104 < 0xfffffffffffffefb) {
      return false;
    }
    if (*wildcard == '\0') {
      return false;
    }
    __dirp = opendir(path);
    if (__dirp != (DIR *)0x0) {
      pdVar5 = readdir(__dirp);
      _Var8 = pdVar5 != (dirent *)0x0;
      if (_Var8) {
        if (isDirectory) {
          pcVar6 = exists_dir;
        }
        else {
          pcVar6 = exists_file;
        }
        do {
          __s1 = pdVar5->d_name;
          iVar3 = strcmp(__s1,".");
          if ((iVar3 != 0) && (iVar3 = strcmp(__s1,".."), iVar3 != 0)) {
            sVar4 = strlen(path);
            sVar7 = strlen(__s1);
            if (0xfffffffffffffefa < (sVar7 + sVar4) - 0x102) {
              strcpy(local_138,path);
              add_slash(local_138);
              strcat(local_138,__s1);
              cVar1 = (*pcVar6)(local_138);
              if ((cVar1 != '\0') && (_Var2 = wildcard_match(wildcard,__s1), _Var2)) {
                strcpy(result,local_138);
                break;
              }
            }
          }
          pdVar5 = readdir(__dirp);
          _Var8 = pdVar5 != (dirent *)0x0;
        } while (_Var8);
      }
      closedir(__dirp);
      return _Var8;
    }
  }
  return false;
}

Assistant:

bool search_directory_or_file(const char *path, const char *wildcard, bool isDirectory, char *result)
{
	if (path == NULL || strlen(path) == 0)
	{
		return false;
	}
	if (wildcard == NULL || strlen(wildcard) == 0)
	{
		return false;
	}
	if (strlen(path) + 1 > MAX_PATH)
	{
		return false;
	}
	DIR *dir;
	char opendirpath[MAX_PATH];
	clear_path_string(opendirpath, MAX_PATH);
#if defined(_WIN32)
	char *res = u8tosjis_path(path, opendirpath);
	if (res == NULL)
	{
		return false;
	}	
	if ((dir = opendir(opendirpath)) == NULL)
#else
	if ((dir = opendir(path)) == NULL)
#endif
	{
		return false;
	}
	char temp[MAX_PATH];
	struct dirent *entry;
	bool found = false;
	//size_t len = strlen(wildcard);
	while ((entry = readdir(dir)) != NULL)
	{
		if (strcmp(entry->d_name, ".") == 0 || strcmp(entry->d_name, "..") == 0)
		{
			continue;
		}
		if (strlen(path) + 1 + strlen(entry->d_name) + 2 > MAX_PATH)
		{
			continue;
		}
		strcpy(temp, path);
		add_slash(temp);
		strcat(temp, entry->d_name);
		if ((isDirectory ? exists_dir : exists_file)(temp))
		{
			if (!wildcard_match(wildcard, entry->d_name))
			{
				continue;
			}
			strcpy(result, temp);
			found = true;
			break;
		}
	}
	closedir(dir);
	return found;
}